

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Copy
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  byte bVar4;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uchar *__src;
  uint local_70;
  uint local_6c;
  Image *local_68;
  undefined8 local_60;
  ImageTemplate<unsigned_char> local_58;
  
  local_60 = CONCAT44(in_register_00000014,startYIn);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  bVar4 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
  local_6c = (uint)bVar4;
  local_70 = width * local_6c;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011dc30;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  local_68 = in;
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_70,&height,in,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011dc30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar1 = out->_rowSize;
  uVar7 = height * uVar1;
  if (uVar7 != 0) {
    puVar3 = out->_data;
    uVar6 = 0;
    uVar5 = startXOut * local_6c;
    uVar2 = local_68->_rowSize;
    __src = local_68->_data + (ulong)(startXIn * local_6c) + (ulong)((int)local_60 * uVar2);
    do {
      memcpy(puVar3 + uVar6 + (ulong)uVar5 + (ulong)(startYOut * uVar1),__src,(ulong)local_70);
      __src = __src + uVar2;
      uVar6 = uVar6 + uVar1;
    } while (uVar7 != uVar6);
  }
  return;
}

Assistant:

void Copy( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn )
            memcpy( outY, inY, sizeof( uint8_t ) * width );
    }